

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeMe.hpp
# Opt level: O2

void SerializeMe::DeserializeFromBuffer<Point3D>(SpanBytesConst *buffer,Point3D *dest)

{
  anon_class_8_1_4eff857e func;
  Serializer<Point3D> local_9;
  anon_class_8_1_4eff857e local_8;
  
  local_8.buffer = buffer;
  Serializer<Point3D>::operator()(&local_9,dest,&local_8);
  return;
}

Assistant:

inline void DeserializeFromBuffer(SpanBytesConst& buffer, T& dest)
{
  if constexpr (std::is_arithmetic_v<T> || std::is_same_v<T, std::byte>)
  {
    auto const S = sizeof(T);
    if (S > buffer.size())
    {
      throw std::runtime_error("DeserializeFromBuffer: buffer overflow");
    }
    dest = *(reinterpret_cast<T const*>(buffer.data()));

#if SERIALIZE_LITTLEENDIAN == 0
    dest = EndianSwap<T>(dest);
#endif
    buffer = SpanBytesConst(buffer.data() + S, buffer.size() - S);   // NOLINT
  }
  else
  {
    static_assert(is_serializer_defined<T>(), "Missing specialization of class "
                                              "Serialize<>. Check errors below");
    if constexpr (is_serializer_defined<T>())
    {
      auto func = [&buffer](auto& field) { DeserializeFromBuffer(buffer, field); };
      Serializer<T>().operator()(const_cast<T&>(dest), func);
    }
  }
}